

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
vkb::PhysicalDeviceSelector::select_device_names_abi_cxx11_
          (Result<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  pointer pPVar1;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *pvVar2;
  PhysicalDevice *pd;
  pointer __x;
  error_code eVar3;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> selected_devices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> RStack_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  select_impl(&RStack_58,this);
  if (RStack_58.m_init == false) {
    eVar3 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::error
                      (&RStack_58);
    (__return_storage_ptr__->field_0).m_error.type._M_value = eVar3._M_value;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)eVar3._M_cat;
  }
  else {
    pvVar2 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::value
                       (&RStack_58);
    if ((pvVar2->super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (pvVar2->super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar2 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::
               value(&RStack_58);
      pPVar1 = (pvVar2->
               super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (__x = (pvVar2->
                 super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>).
                 _M_impl.super__Vector_impl_data._M_start; __x != pPVar1; __x = __x + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_38,&__x->name);
      }
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_38.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_38.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_38.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->m_init = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_38);
      goto LAB_00105a00;
    }
    (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
  }
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  __return_storage_ptr__->m_init = false;
LAB_00105a00:
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::destroy
            (&RStack_58);
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<std::string>> PhysicalDeviceSelector::select_device_names() const {
    auto const selected_devices = select_impl();
    if (!selected_devices) return Result<std::vector<std::string>>{ selected_devices.error() };
    if (selected_devices.value().size() == 0) {
        return Result<std::vector<std::string>>{ PhysicalDeviceError::no_suitable_device };
    }
    std::vector<std::string> names;
    for (const auto& pd : selected_devices.value()) {
        names.push_back(pd.name);
    }
    return names;
}